

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O2

bool __thiscall ON_XMLNode::MergeFrom(ON_XMLNode *this,ON_XMLNode *src)

{
  ON_XMLNodePrivate *pOVar1;
  ON_XMLNode *src_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  ON_XMLProperty *pOVar5;
  undefined4 extraout_var_00;
  wchar_t *pwVar6;
  long *plVar7;
  ON_XMLNode *this_00;
  recursive_mutex *__mutex;
  recursive_mutex *__mutex_00;
  ChildIterator ci;
  PropertyIterator pi;
  ChildIterator local_50;
  PropertyIterator local_40;
  undefined4 extraout_var_01;
  
  __mutex = &this->_private->m_mutex;
  std::recursive_mutex::lock(__mutex);
  __mutex_00 = &src->_private->m_mutex;
  std::recursive_mutex::lock(__mutex_00);
  pOVar1 = this->_private;
  iVar3 = (*src->_vptr_ON_XMLNode[3])(src);
  bVar2 = ::operator!=(&pOVar1->m_name,(ON_wString *)CONCAT44(extraout_var,iVar3));
  if (!bVar2) {
    (*src->_vptr_ON_XMLNode[0x2d])(&local_40,src,0);
    while( true ) {
      pOVar5 = PropertyIterator::GetNextProperty(&local_40);
      if (pOVar5 == (ON_XMLProperty *)0x0) break;
      (*this->_vptr_ON_XMLNode[0xd])(this,pOVar5);
    }
    iVar3 = (*this->_vptr_ON_XMLNode[0x22])(this);
    (*src->_vptr_ON_XMLNode[0x2c])(&local_50,src);
LAB_0067dbdb:
    do {
      src_00 = (local_50._private)->_current;
      if (src_00 == (ON_XMLNode *)0x0) goto LAB_0067dc52;
      (local_50._private)->_current = src_00->_private->m_next_sibling;
      if (iVar3 != 0) {
        iVar4 = (*src_00->_vptr_ON_XMLNode[3])(src_00);
        pwVar6 = ON_wString::operator_cast_to_wchar_t_
                           ((ON_wString *)CONCAT44(extraout_var_00,iVar4));
        iVar4 = (*this->_vptr_ON_XMLNode[0x29])(this,pwVar6);
        plVar7 = (long *)CONCAT44(extraout_var_01,iVar4);
        if (plVar7 != (long *)0x0) {
          (**(code **)(*plVar7 + 0x10))(plVar7,src_00);
          goto LAB_0067dbdb;
        }
      }
      this_00 = (ON_XMLNode *)operator_new(0xe8);
      ON_XMLNode(this_00,src_00);
      (*this->_vptr_ON_XMLNode[0xb])(this,this_00);
    } while( true );
  }
LAB_0067dc6a:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return !bVar2;
LAB_0067dc52:
  ChildIterator::~ChildIterator(&local_50);
  PropertyIterator::~PropertyIterator(&local_40);
  goto LAB_0067dc6a;
}

Assistant:

bool ON_XMLNode::MergeFrom(const ON_XMLNode& src)
{
  std::lock_guard<std::recursive_mutex> lg1(_private->m_mutex);
  std::lock_guard<std::recursive_mutex> lg2(src._private->m_mutex);

  if (_private->m_name != src.TagName())
    return false;

  // Copy in the parameters.
  ON_XMLProperty* pProperty = nullptr;

  auto pi = src.GetPropertyIterator();
  while (nullptr != (pProperty = pi.GetNextProperty()))
  {
    // Replaces any that are already there.
    SetProperty(*pProperty);
  }

  // Copy in the children.
  const auto bNeedToMerge = ChildCount() != 0;

  ON_XMLNode* pChild = nullptr;
  auto ci = src.GetChildIterator();
  while (nullptr != (pChild = ci.GetNextChild()))
  {
    auto* pLocalChildNode = bNeedToMerge ? GetNodeAtPath(pChild->TagName()) : nullptr;
    if (nullptr != pLocalChildNode)
    {
      pLocalChildNode->MergeFrom(*pChild);
    }
    else
    {
      AttachChildNode(new ON_XMLNode(*pChild));
    }
  }

  return true;
}